

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

CookieInfo * Curl_cookie_init(SessionHandle *data,char *file,CookieInfo *inc,_Bool newsession)

{
  int iVar1;
  CookieInfo *c;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  
  c = inc;
  if (inc == (CookieInfo *)0x0) {
    c = (CookieInfo *)(*Curl_ccalloc)(1,0x28);
    if (c != (CookieInfo *)0x0) {
      pcVar2 = "none";
      if (file != (char *)0x0) {
        pcVar2 = file;
      }
      pcVar2 = (*Curl_cstrdup)(pcVar2);
      c->filename = pcVar2;
      if (pcVar2 != (char *)0x0) goto LAB_005676df;
      __stream = (FILE *)0x0;
      (*Curl_cfree)((void *)0x0);
      bVar4 = true;
LAB_0056785e:
      Curl_cookie_cleanup(c);
LAB_00567866:
      if (__stream != (FILE *)0x0 && bVar4) {
        fclose(__stream);
      }
    }
    c = (CookieInfo *)0x0;
  }
  else {
LAB_005676df:
    c->running = false;
    if (file == (char *)0x0) {
LAB_00567840:
      c->newsession = newsession;
    }
    else {
      iVar1 = curl_strequal(file,"-");
      if (iVar1 == 0) {
        if (*file == '\0') goto LAB_00567840;
        __stream = fopen64(file,"r");
        bVar4 = true;
      }
      else {
        bVar4 = false;
        __stream = _stdin;
      }
      c->newsession = newsession;
      if (__stream != (FILE *)0x0) {
        pcVar2 = (char *)(*Curl_cmalloc)(5000);
        if (pcVar2 == (char *)0x0) {
          (*Curl_cfree)((void *)0x0);
          if (inc == (CookieInfo *)0x0) goto LAB_0056785e;
          goto LAB_00567866;
        }
        pcVar3 = fgets(pcVar2,5000,__stream);
        if (pcVar3 != (char *)0x0) {
          do {
            iVar1 = Curl_raw_nequal("Set-Cookie:",pcVar2,0xb);
            pcVar3 = pcVar2;
            if (iVar1 != 0) {
              pcVar3 = pcVar2 + 0xb;
            }
            for (; (*pcVar3 == ' ' || (*pcVar3 == '\t')); pcVar3 = pcVar3 + 1) {
            }
            Curl_cookie_add(data,c,iVar1 != 0,pcVar3,(char *)0x0,(char *)0x0);
            pcVar3 = fgets(pcVar2,5000,__stream);
          } while (pcVar3 != (char *)0x0);
        }
        (*Curl_cfree)(pcVar2);
        if (bVar4) {
          fclose(__stream);
        }
      }
    }
    c->running = true;
  }
  return c;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct SessionHandle *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *fp = NULL;
  bool fromfile=TRUE;
  char *line = NULL;

  if(NULL == inc) {
    /* we didn't get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    c->filename = strdup(file?file:"none"); /* copy the name just in case */
    if(!c->filename)
      goto fail; /* failed to get memory */
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->running = FALSE; /* this is not running, this is init */

  if(file && strequal(file, "-")) {
    fp = stdin;
    fromfile=FALSE;
  }
  else if(file && !*file) {
    /* points to a "" string */
    fp = NULL;
  }
  else
    fp = file?fopen(file, FOPEN_READTEXT):NULL;

  c->newsession = newsession; /* new session? */

  if(fp) {
    char *lineptr;
    bool headerline;

    line = malloc(MAX_COOKIE_LINE);
    if(!line)
      goto fail;
    while(fgets(line, MAX_COOKIE_LINE, fp)) {
      if(checkprefix("Set-Cookie:", line)) {
        /* This is a cookie line, get it! */
        lineptr=&line[11];
        headerline=TRUE;
      }
      else {
        lineptr=line;
        headerline=FALSE;
      }
      while(*lineptr && ISBLANK(*lineptr))
        lineptr++;

      Curl_cookie_add(data, c, headerline, lineptr, NULL, NULL);
    }
    free(line); /* free the line buffer */

    if(fromfile)
      fclose(fp);
  }

  c->running = TRUE;          /* now, we're running */

  return c;

fail:
  free(line);
  if(!inc)
    /* Only clean up if we allocated it here, as the original could still be in
     * use by a share handle */
    Curl_cookie_cleanup(c);
  if(fromfile && fp)
    fclose(fp);
  return NULL; /* out of memory */
}